

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_>_>
  _Var4;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge> *pPVar5;
  char *pcVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  char *value_param;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  size_t sVar17;
  const_iterator cVar18;
  int *piVar19;
  undefined4 extraout_var;
  undefined4 *puVar20;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar21;
  pointer pIVar22;
  long lVar23;
  uint uVar24;
  element_type *peVar25;
  long lVar26;
  bool bVar27;
  string param_name;
  string test_suite_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>
  generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_328;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge> *local_320;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  char *local_310;
  element_type *local_308;
  string local_300;
  size_t local_2e0;
  char *local_2d8;
  undefined8 local_2d0;
  char local_2c8 [16];
  long *local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  ParamNameGeneratorFunc *local_298;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  CodeLocation local_260;
  char *local_238;
  char local_228 [16];
  string local_218;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  _Head_base<0UL,_const_libaom_test::CodecFactory_*,_false> local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  psVar21 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_320 = this;
  if (psVar21 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar10 = false;
    do {
      peVar25 = (psVar21->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_318 = (psVar21->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi;
      if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_318->_M_use_count = local_318->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_318->_M_use_count = local_318->_M_use_count + 1;
        }
      }
      pIVar22 = (local_320->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_308 = peVar25;
      local_2a8 = psVar21;
      if (pIVar22 !=
          (local_320->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*pIVar22->generator)(&local_2b8);
          local_298 = pIVar22->name_func;
          local_310 = pIVar22->file;
          iVar12 = pIVar22->line;
          local_2d8 = local_2c8;
          local_2d0 = 0;
          local_2c8[0] = '\0';
          sVar2 = (pIVar22->name)._M_string_length;
          if (sVar2 != 0) {
            local_1b8._0_8_ = &local_1a8;
            pcVar3 = (pIVar22->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_2d8,(string *)local_1b8);
            if ((_Head_base<0UL,_const_libaom_test::CodecFactory_*,_false> *)local_1b8._0_8_ !=
                &local_1a8) {
              operator_delete((void *)local_1b8._0_8_);
            }
          }
          local_2a0 = pIVar22;
          std::__cxx11::string::_M_append
                    ((char *)&local_2d8,(ulong)(peVar25->test_suite_base_name)._M_dataplus._M_p);
          local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_290._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_290._M_impl.super__Rb_tree_header._M_header;
          local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_290._M_impl.super__Rb_tree_header._M_header._M_right =
               local_290._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar13 = (long *)(**(code **)(*local_2b8 + 0x10))();
          local_2e0 = 0;
          while( true ) {
            plVar14 = (long *)(**(code **)(*local_2b8 + 0x18))();
            if (plVar13 == plVar14) {
              bVar9 = 0;
            }
            else {
              bVar9 = (**(code **)(*plVar13 + 0x30))(plVar13,plVar14);
              bVar9 = bVar9 ^ 1;
            }
            if (plVar14 != (long *)0x0) {
              (**(code **)(*plVar14 + 8))(plVar14);
            }
            if (bVar9 == 0) break;
            Message::Message((Message *)&local_328);
            puVar15 = (undefined8 *)(**(code **)(*plVar13 + 0x28))();
            local_1a8._M_head_impl = (CodecFactory *)puVar15[2];
            local_1b8._0_8_ = *puVar15;
            local_1b8._8_8_ = puVar15[1];
            local_1a0 = local_2e0;
            (*local_298)(&local_300,
                         (TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>
                          *)local_1b8);
            _Var8._M_p = local_300._M_dataplus._M_p;
            if (local_300._M_string_length == 0) {
              bVar10 = false;
            }
            else {
              lVar23 = local_300._M_string_length - 1;
              lVar26 = 0;
              do {
                uVar24 = (uint)(byte)_Var8._M_p[lVar26];
                iVar11 = isalnum(uVar24);
                bVar10 = iVar11 != 0 || uVar24 == 0x5f;
                if (iVar11 == 0 && uVar24 != 0x5f) break;
                bVar27 = lVar23 != lVar26;
                lVar26 = lVar26 + 1;
              } while (bVar27);
            }
            bVar10 = IsTrue(bVar10);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_300._M_dataplus._M_p,
                                   local_300._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' is invalid, in ",0x11);
              pcVar6 = local_310;
              if (local_310 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_310);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar6,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,iVar12);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_290,&local_300);
            bVar10 = IsTrue((_Rb_tree_header *)cVar18._M_node ==
                            &local_290._M_impl.super__Rb_tree_header);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_300._M_dataplus._M_p,
                                   local_300._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\', in ",6);
              pcVar6 = local_310;
              if (local_310 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_310);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar6,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,iVar12);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_290,&local_300);
            sVar2 = (peVar25->test_base_name)._M_string_length;
            if (sVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_328._M_head_impl + 0x10),
                         (peVar25->test_base_name)._M_dataplus._M_p,sVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_328._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_328._M_head_impl + 0x10),local_300._M_dataplus._M_p,
                       local_300._M_string_length);
            pcVar6 = local_2d8;
            Message::GetString_abi_cxx11_(&local_218,(Message *)&local_328);
            _Var8._M_p = local_218._M_dataplus._M_p;
            piVar19 = (int *)(**(code **)(*plVar13 + 0x28))();
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
            PointerPrinter::PrintValue<libaom_test::CodecFactory_const>
                      (*(CodecFactory **)(piVar19 + 4),(ostream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            std::ostream::operator<<((ostream *)&local_1a8,piVar19[3]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            anon_unknown.dwarf_8b4be9::operator<<
                      ((ostream *)&local_1a8,(kfIntervalParam *)(piVar19 + 1));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            std::ostream::operator<<((ostream *)&local_1a8,*piVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
            value_param = local_238;
            peVar25 = local_308;
            local_260.file._M_dataplus._M_p = (pointer)&local_260.file.field_2;
            pcVar3 = (local_308->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,pcVar3,
                       pcVar3 + (local_308->code_location).file._M_string_length);
            local_260.line = (peVar25->code_location).line;
            iVar11 = (*(local_320->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar10 = IsTrue(true);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar7 = local_310;
              if (local_310 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_310);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar12);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            bVar10 = IsTrue(true);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar7 = local_310;
              if (local_310 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_310);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar12);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            _Var4.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_false>
            ._M_head_impl =
                 (local_308->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_false>
            ;
            puVar20 = (undefined4 *)(**(code **)(*plVar13 + 0x28))();
            local_1e8 = *(undefined8 *)(puVar20 + 4);
            local_1f8 = *puVar20;
            uStack_1f4 = puVar20[1];
            uStack_1f0 = puVar20[2];
            uStack_1ec = puVar20[3];
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var4.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var4.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::kfIntervalParam,_aom_rc_mode>_>_*,_false>
                                 ._M_head_impl,&local_1f8);
            MakeAndRegisterTestInfo
                      (pcVar6,_Var8._M_p,(char *)0x0,value_param,&local_260,
                       (TypeId)CONCAT44(extraout_var,iVar11),(SetUpTestSuiteFunc)0x0,
                       (TearDownTestSuiteFunc)0x0,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260.file._M_dataplus._M_p != &local_260.file.field_2) {
              operator_delete(local_260.file._M_dataplus._M_p);
            }
            peVar25 = local_308;
            if (local_238 != local_228) {
              operator_delete(local_238);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_dataplus._M_p != &local_300.field_2) {
              operator_delete(local_300._M_dataplus._M_p);
            }
            if (local_328._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_328._M_head_impl + 8))();
            }
            (**(code **)(*plVar13 + 0x18))();
            local_2e0 = local_2e0 + 1;
            bVar10 = true;
          }
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_290);
          if (local_2d8 != local_2c8) {
            operator_delete(local_2d8);
          }
          if (local_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0);
          }
          pIVar22 = local_2a0 + 1;
        } while (pIVar22 !=
                 (local_320->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
      }
      psVar21 = local_2a8 + 1;
    } while (psVar21 !=
             (local_320->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar10) {
      return;
    }
  }
  pPVar5 = local_320;
  iVar12 = (*(local_320->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_320);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (pPVar5->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (pPVar5->code_location_).file._M_string_length);
  local_1e0.line = (pPVar5->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar12),&local_1e0,
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::KeyFrameIntervalTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }